

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O0

void __thiscall
GetOpt::OptionsFileNotFoundEx::OptionsFileNotFoundEx(OptionsFileNotFoundEx *this,string *file)

{
  string *file_local;
  OptionsFileNotFoundEx *this_local;
  
  GetOptEx::GetOptEx(&this->super_GetOptEx);
  this->super_GetOptEx = (GetOptEx)&PTR__OptionsFileNotFoundEx_00125c70;
  std::__cxx11::string::string((string *)&this->targetFile,(string *)file);
  return;
}

Assistant:

OptionsFileNotFoundEx(const std::string& file) : targetFile(file) {}